

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinExporter.cpp
# Opt level: O1

size_t Assimp::WriteBounds<aiVectorKey>(IOStream *stream,aiVectorKey *in,uint size)

{
  float fVar1;
  float fVar2;
  float fVar3;
  double dVar4;
  long lVar5;
  double local_68;
  float fStack_60;
  float fStack_5c;
  float local_58 [4];
  double local_48;
  float fStack_40;
  float fStack_3c;
  float local_38 [2];
  
  local_68 = -10000000000.0;
  local_48 = 10000000000.0;
  fStack_60 = -1e+10;
  fStack_5c = -1e+10;
  local_58[0] = -1e+10;
  fStack_40 = 1e+10;
  fStack_3c = 1e+10;
  local_38[0] = 1e+10;
  if (size != 0) {
    local_48 = 10000000000.0;
    local_38[0] = 1e+10;
    local_68 = -10000000000.0;
    local_58[0] = -1e+10;
    lVar5 = 0;
    do {
      dVar4 = *(double *)((long)&in->mTime + lVar5);
      if (dVar4 <= local_48) {
        local_48 = dVar4;
      }
      fVar1 = *(float *)((long)&(in->mValue).x + lVar5);
      if (fVar1 <= fStack_40) {
        fStack_40 = fVar1;
      }
      fVar2 = *(float *)((long)&(in->mValue).y + lVar5);
      if (fVar2 <= fStack_3c) {
        fStack_3c = fVar2;
      }
      fVar3 = *(float *)((long)&(in->mValue).z + lVar5);
      if (fVar3 <= local_38[0]) {
        local_38[0] = fVar3;
      }
      if (local_68 <= dVar4) {
        local_68 = dVar4;
      }
      if (fStack_60 <= fVar1) {
        fStack_60 = fVar1;
      }
      if (fStack_5c <= fVar2) {
        fStack_5c = fVar2;
      }
      if (local_58[0] <= fVar3) {
        local_58[0] = fVar3;
      }
      lVar5 = lVar5 + 0x18;
    } while ((ulong)size * 0x18 != lVar5);
  }
  (*stream->_vptr_IOStream[3])(stream,&local_48,8,1);
  (*stream->_vptr_IOStream[3])(stream,&fStack_40,4,1);
  (*stream->_vptr_IOStream[3])(stream,&fStack_3c,4,1);
  (*stream->_vptr_IOStream[3])(stream,local_38,4,1);
  (*stream->_vptr_IOStream[3])(stream,&local_68,8,1);
  (*stream->_vptr_IOStream[3])(stream,&fStack_60,4,1);
  (*stream->_vptr_IOStream[3])(stream,&fStack_5c,4,1);
  (*stream->_vptr_IOStream[3])(stream,local_58,4,1);
  return 0x28;
}

Assistant:

inline
size_t WriteBounds(IOStream * stream, const T* in, unsigned int size) {
    T minc, maxc;
    ArrayBounds(in,size,minc,maxc);

    const size_t t = Write<T>(stream,minc);
    return t + Write<T>(stream,maxc);
}